

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

bool __thiscall
Js::StepController::IsStepComplete_AllowingFalsePositives
          (StepController *this,InterpreterStackFrame *stackFrame)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  DWORD_PTR DVar7;
  InterpreterStackFrame *stackFrame_local;
  StepController *this_local;
  
  if (stackFrame == (InterpreterStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                ,0xdf,"(stackFrame)","stackFrame");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this->stepType == STEP_IN) {
    this_local._7_1_ = true;
  }
  else if (this->stepType == STEP_DOCUMENT) {
    pFVar6 = InterpreterStackFrame::GetFunctionBody(stackFrame);
    if (pFVar6 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                  ,0xe6,"(stackFrame->GetFunctionBody())",
                                  "stackFrame->GetFunctionBody()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pFVar6 = InterpreterStackFrame::GetFunctionBody(stackFrame);
    uVar4 = GetScriptId(this,pFVar6);
    this_local._7_1_ = uVar4 != this->scriptIdWhenSet;
  }
  else {
    uVar1 = this->frameAddrWhenSet;
    DVar7 = InterpreterStackFrame::GetStackAddress(stackFrame);
    this_local._7_1_ = uVar1 <= DVar7;
  }
  return this_local._7_1_;
}

Assistant:

bool StepController::IsStepComplete_AllowingFalsePositives(InterpreterStackFrame * stackFrame)
    {
        Assert(stackFrame);
        if (stepType == STEP_IN)
        {
            return true;
        }
        else if (stepType == STEP_DOCUMENT)
        {
            Assert(stackFrame->GetFunctionBody());
            return GetScriptId(stackFrame->GetFunctionBody()) != this->scriptIdWhenSet;
        }

        // A STEP_OUT or a STEP_OVER has not completed if we are currently deeper on the callstack.
        return this->frameAddrWhenSet <= stackFrame->GetStackAddress();
    }